

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

Texture * __thiscall
rengine::OpenGLRenderer::createTextureFromImageData
          (OpenGLRenderer *this,vec2 size,Format format,void *data)

{
  OpenGLTexture *this_00;
  OpenGLTexture *texture;
  void *data_local;
  Format format_local;
  OpenGLRenderer *this_local;
  vec2 size_local;
  
  this_00 = (OpenGLTexture *)operator_new(0x18);
  OpenGLTexture::OpenGLTexture(this_00);
  OpenGLTexture::setFormat(this_00,format);
  this_local._0_4_ = size.x;
  this_local._4_4_ = size.y;
  OpenGLTexture::upload(this_00,(int)this_local._0_4_,(int)this_local._4_4_,data);
  return &this_00->super_Texture;
}

Assistant:

inline Texture *OpenGLRenderer::createTextureFromImageData(vec2 size, Texture::Format format, void *data)
{
    OpenGLTexture *texture = new OpenGLTexture();
    texture->setFormat(format);
    texture->upload(size.x, size.y, data);
    return texture;
}